

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O0

double __thiscall PriorityBranchGroup::getScore(PriorityBranchGroup *this,VarBranch vb)

{
  uint uVar1;
  Branching **ppBVar2;
  uint in_ESI;
  long in_RDI;
  double extraout_XMM0_Qa;
  uint i;
  double sum;
  uint local_1c;
  double local_18;
  
  local_18 = 0.0;
  local_1c = 0;
  while( true ) {
    uVar1 = vec<Branching_*>::size((vec<Branching_*> *)(in_RDI + 8));
    if (uVar1 <= local_1c) break;
    ppBVar2 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 8),local_1c);
    (*(*ppBVar2)->_vptr_Branching[1])(*ppBVar2,(ulong)in_ESI);
    local_18 = extraout_XMM0_Qa + local_18;
    local_1c = local_1c + 1;
  }
  uVar1 = vec<Branching_*>::size((vec<Branching_*> *)(in_RDI + 8));
  return local_18 / (double)uVar1;
}

Assistant:

double PriorityBranchGroup::getScore(VarBranch vb) {
	double sum = 0;
	for (unsigned int i = 0; i < x.size(); i++) {
		sum += x[i]->getScore(vb);
	}
	return sum / x.size();
}